

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# division.h
# Opt level: O0

void __thiscall Division_Zero_Test::~Division_Zero_Test(Division_Zero_Test *this)

{
  Division_Zero_Test *this_local;
  
  ~Division_Zero_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Division, Zero)
{
    BigNumber num_1 = BigNumber("0") / BigNumber("1");
    BigNumber num_2 = BigNumber("0") / BigNumber("-1");
    BigNumber num_3 = BigNumber("0") % BigNumber("1");
    BigNumber num_4 = BigNumber("0") % BigNumber("-1");
    EXPECT_EQ("0", num_1.toString());
    EXPECT_EQ("0", num_2.toString());
    EXPECT_EQ("0", num_3.toString());
    EXPECT_EQ("0", num_4.toString());
}